

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

void hrgls::datablob::StreamCallbackHandler(hrgls_DataBlob blob,void *userData)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  DataBlob f;
  DataBlob local_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)((long)userData + 0x48));
  if (iVar3 == 0) {
    pcVar1 = *(code **)((long)userData + 0x38);
    uVar2 = *(undefined8 *)((long)userData + 0x40);
    pthread_mutex_unlock((pthread_mutex_t *)((long)userData + 0x48));
    if (*(long *)((long)userData + 0x38) != 0) {
      DataBlob::DataBlob(&local_30,blob);
      (*pcVar1)(&local_30,uVar2);
      DataBlob::~DataBlob(&local_30);
    }
    hrgls_DataBlobDestroy(blob);
    return;
  }
  uVar2 = std::__throw_system_error(iVar3);
  DataBlob::~DataBlob(&local_30);
  _Unwind_Resume(uVar2);
}

Assistant:

static void StreamCallbackHandler(hrgls_DataBlob const blob, void *userData)
    {
      // Convert the userData into a pointer to the private data we need.
      DataBlobSource::DataBlobSource_private *info =
        static_cast<DataBlobSource::DataBlobSource_private*>(userData);

      // Lock the mutex so that it does not get changed out from under us
      // while we get its info.
      hrgls::datablob::StreamCallback cb;
      void *ud;
      {
        std::lock_guard<std::mutex> lock(info->m_cppMutex);
        cb = info->m_cppHandler;
        ud = info->m_cppUserData;
      }

      // Reformat the data into a C++ structure.
      // Call the callback handler with the data.
      if (info->m_cppHandler) {
        DataBlob f(blob);
        cb(f, ud);
      }

      // In the C API, we always have to destroy the blob that is handed
      // to us, so we do so here.  The DataBlob above will have created
      // a copy and destroyed that copy, but here we destroy the one that
      // was passed to us.
      hrgls_DataBlobDestroy(blob);
    }